

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_lib.cc
# Opt level: O3

int load_iv(char **fromp,uchar *to,size_t num)

{
  int iVar1;
  ulong uVar2;
  byte bVar3;
  char *pcVar4;
  uint8_t v;
  uint8_t local_39;
  char **local_38;
  
  pcVar4 = *fromp;
  if (num != 0) {
    bVar3 = 0;
    local_38 = fromp;
    memset(to,0,num);
    uVar2 = 0;
    do {
      iVar1 = OPENSSL_fromxdigit(&local_39,(int)pcVar4[uVar2]);
      if (iVar1 == 0) {
        ERR_put_error(9,0,0x67,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_lib.cc"
                      ,0x1c9);
        return 0;
      }
      to[uVar2 >> 1] = to[uVar2 >> 1] | local_39 << (~bVar3 & 4);
      uVar2 = uVar2 + 1;
      bVar3 = bVar3 + 4;
    } while (num * 2 + (ulong)(num * 2 == 0) != uVar2);
    pcVar4 = pcVar4 + uVar2;
    fromp = local_38;
  }
  *fromp = pcVar4;
  return 1;
}

Assistant:

static int load_iv(const char **fromp, unsigned char *to, size_t num) {
  uint8_t v;
  const char *from;

  from = *fromp;
  for (size_t i = 0; i < num; i++) {
    to[i] = 0;
  }
  num *= 2;
  for (size_t i = 0; i < num; i++) {
    if (!OPENSSL_fromxdigit(&v, *from)) {
      OPENSSL_PUT_ERROR(PEM, PEM_R_BAD_IV_CHARS);
      return 0;
    }
    from++;
    to[i / 2] |= v << (!(i & 1)) * 4;
  }

  *fromp = from;
  return 1;
}